

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayStrideGroup::init
          (SingleVertexArrayStrideGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  InputType IVar2;
  Storage storage_;
  GLValue max_;
  int iVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  MultiVertexArrayTest *this_00;
  ulong *puVar8;
  int **ppiVar9;
  Storage extraout_EDX;
  Storage storage;
  ulong uVar10;
  int *piVar11;
  undefined8 uVar12;
  long lVar13;
  bool bVar14;
  GLValue GVar15;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  int local_1d0;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  pointer pAStack_1b0;
  pointer local_1a8;
  long local_1a0;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  long local_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [16];
  int *local_a0;
  long lStack_98;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_1a0 = 0;
  do {
    local_1d0 = 2;
    do {
      local_158 = 0;
      do {
        lVar13 = 0;
        do {
          IVar2 = this->m_type;
          if (lVar13 == 0) {
            iVar3 = 0x10;
            if ((IVar2 & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar3 = deqp::gls::Array::inputTypeSize(IVar2);
              iVar3 = iVar3 * local_1d0;
            }
          }
          else {
            iVar3 = *(int *)((long)&DAT_01c6cb88 + lVar13);
          }
          iVar4 = deqp::gls::Array::inputTypeSize(this->m_type);
          if (local_1a0 == 1) {
            iVar5 = 1;
            if ((IVar2 & ~INPUTTYPE_FIXED) == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar5 = local_1d0;
            }
            storage = iVar3 % (iVar4 * iVar5);
            bVar14 = storage != STORAGE_USER;
          }
          else {
            bVar14 = false;
            storage = extraout_EDX;
          }
          storage_ = deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                     arrayUsageChoices[local_1a0];
          deqp::gls::Array::storageToString_abi_cxx11_(&local_70,(Array *)(ulong)storage_,storage);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
          puVar8 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar8) {
            local_120 = *puVar8;
            lStack_118 = plVar6[3];
            local_130 = &local_120;
          }
          else {
            local_120 = *puVar8;
            local_130 = (ulong *)*plVar6;
          }
          local_128 = plVar6[1];
          *plVar6 = (long)puVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          typeToString<int>(&local_d0,iVar3);
          uVar10 = 0xf;
          if (local_130 != &local_120) {
            uVar10 = local_120;
          }
          if (uVar10 < local_d0._M_string_length + local_128) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar12 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_d0._M_string_length + local_128) goto LAB_013b9655;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
          }
          else {
LAB_013b9655:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)local_d0._M_dataplus._M_p);
          }
          local_198 = &local_188;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_188 = *plVar6;
            uStack_180 = puVar7[3];
          }
          else {
            local_188 = *plVar6;
            local_198 = (long *)*puVar7;
          }
          local_190 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)plVar6 = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
          local_150 = &local_140;
          puVar8 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar8) {
            local_140 = *puVar8;
            lStack_138 = plVar6[3];
          }
          else {
            local_140 = *puVar8;
            local_150 = (ulong *)*plVar6;
          }
          local_148 = plVar6[1];
          *plVar6 = (long)puVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          typeToString<int>(&local_f0,local_1d0);
          uVar10 = 0xf;
          if (local_150 != &local_140) {
            uVar10 = local_140;
          }
          if (uVar10 < local_f0._M_string_length + local_148) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar12 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_f0._M_string_length + local_148) goto LAB_013b97a1;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_150);
          }
          else {
LAB_013b97a1:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_150,(ulong)local_f0._M_dataplus._M_p);
          }
          local_1c8._0_8_ = &local_1b8;
          ppAVar1 = (pointer *)(puVar7 + 2);
          if ((pointer *)*puVar7 == ppAVar1) {
            local_1b8 = *ppAVar1;
            pAStack_1b0 = (pointer)puVar7[3];
          }
          else {
            local_1b8 = *ppAVar1;
            local_1c8._0_8_ = (pointer *)*puVar7;
          }
          local_1c8._8_8_ = puVar7[1];
          *puVar7 = ppAVar1;
          puVar7[1] = 0;
          *(undefined1 *)ppAVar1 = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_1c8);
          local_b0._0_8_ = &local_a0;
          ppiVar9 = (int **)(plVar6 + 2);
          if ((int **)*plVar6 == ppiVar9) {
            local_a0 = *ppiVar9;
            lStack_98 = plVar6[3];
          }
          else {
            local_a0 = *ppiVar9;
            local_b0._0_8_ = (int **)*plVar6;
          }
          local_b0._8_8_ = plVar6[1];
          *plVar6 = (long)ppiVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          iVar4 = (&DAT_01c06180)[local_158];
          typeToString<int>(&local_110,iVar4);
          piVar11 = (int *)0xf;
          if ((int **)local_b0._0_8_ != &local_a0) {
            piVar11 = local_a0;
          }
          if (piVar11 < (int *)(local_110._M_string_length + local_b0._8_8_)) {
            uVar12 = (int *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              uVar12 = local_110.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < (int *)(local_110._M_string_length + local_b0._8_8_))
            goto LAB_013b98f9;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_b0._0_8_);
          }
          else {
LAB_013b98f9:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_b0,(ulong)local_110._M_dataplus._M_p);
          }
          local_178 = &local_168;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_168 = *plVar6;
            uStack_160 = puVar7[3];
          }
          else {
            local_168 = *plVar6;
            local_178 = (long *)*puVar7;
          }
          local_170 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)plVar6 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((int **)local_b0._0_8_ != &local_a0) {
            operator_delete((void *)local_b0._0_8_,(long)local_a0 + 1);
          }
          if ((pointer *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)((long)&local_1b8->inputType + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_198 != &local_188) {
            operator_delete(local_198,local_188 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          IVar2 = this->m_type;
          if (IVar2 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            if (local_1d0 == 4) {
LAB_013b9adc:
              GVar15 = deqp::gls::GLValue::getMinValue(IVar2);
              aStack_38 = GVar15.field_1;
              local_40 = GVar15.type;
              GVar15 = deqp::gls::GLValue::getMaxValue(this->m_type);
              aStack_48 = GVar15.field_1;
              local_50 = GVar15.type;
              max_._4_4_ = uStack_4c;
              max_.type = local_50;
              GVar15._4_4_ = uStack_3c;
              GVar15.type = local_40;
              GVar15.field_1 = aStack_38;
              max_.field_1 = aStack_48;
              deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                        ((ArraySpec *)local_b0,IVar2,OUTPUTTYPE_VEC4,storage_,USAGE_DYNAMIC_DRAW,
                         local_1d0,0,iVar3,false,GVar15,max_);
              local_1b8 = (pointer)0x0;
              pAStack_1b0 = (pointer)0x0;
              local_1a8 = (pointer)0x0;
              local_1c8._4_4_ = iVar4;
              local_1c8._0_4_ = 1;
              local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffff00000000;
              std::
              vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
              ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                        ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                          *)&local_1b8,(iterator)0x0,(ArraySpec *)local_b0);
              if (bVar14) {
                this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
                deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                          (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                   m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                           (Spec *)local_1c8,(char *)local_178,(char *)local_178);
                tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
              }
              if (local_1b8 != (pointer)0x0) {
                operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
              }
            }
          }
          else if (local_1d0 == 4 || IVar2 != INPUTTYPE_INT_2_10_10_10) goto LAB_013b9adc;
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0xc);
        bVar14 = local_158 == 0;
        local_158 = local_158 + 1;
      } while (bVar14);
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 != 5);
    lVar13 = local_1a0 + 1;
    bVar14 = local_1a0 != 0;
    local_1a0 = lVar13;
    if (bVar14) {
      return (int)lVar13;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayStrideGroup::init (void)
{
	Array::Storage		storages[]		= {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	int					counts[]		= {1, 256};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		for (int componentCount = 2; componentCount < 5; componentCount++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (16) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	bufferUnaligned	= (storages[storageNdx] == Array::STORAGE_BUFFER) && (stride % alignment) != 0;

					std::string name = Array::storageToString(storages[storageNdx]) + "_stride" + typeToString(stride) + "_components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					if (bufferUnaligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}